

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O1

void processDatatypeValidator(DatatypeValidator *dtValidator,bool margin)

{
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *pRVar1;
  XMLSize_t XVar2;
  wchar16 *toInsert;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar3;
  bool bVar4;
  int iVar5;
  XMLSize_t XVar6;
  KVStringPair *pKVar7;
  char16_t *pcVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  BaseRefVectorOf<char16_t> *this;
  _func_int **__s;
  long lVar12;
  char16_t *pcVar13;
  long *plVar14;
  char16_t cVar15;
  XMLSize_t getAt;
  RefVectorOf<char16_t> sortedList;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> enumFacets;
  BaseRefVectorOf<char16_t> local_a0;
  StrX local_70;
  StrX local_68;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_60;
  
  if (dtValidator == (DatatypeValidator *)0x0) {
    return;
  }
  if (margin) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Base Datatype:\t\t",0x10);
  switch(*(undefined4 *)(dtValidator + 0x1c)) {
  case 0:
    pcVar9 = "string";
    goto LAB_00105192;
  case 1:
    pcVar9 = "AnyURI";
    goto LAB_00105192;
  case 2:
    pcVar9 = "QName";
    goto LAB_00105153;
  case 3:
    pcVar9 = "Name";
    goto LAB_0010512b;
  case 4:
    pcVar9 = "NCName";
    goto LAB_00105192;
  case 5:
    pcVar9 = "Boolean";
    goto LAB_0010517d;
  case 6:
    pcVar9 = "Float";
    goto LAB_00105153;
  case 7:
    pcVar9 = "Double";
    goto LAB_00105192;
  case 8:
    pcVar9 = "Decimal";
    goto LAB_0010517d;
  case 9:
    pcVar9 = "HexBinary";
    goto LAB_00105049;
  case 10:
    pcVar9 = "Base64Binary";
    lVar12 = 0xc;
    break;
  case 0xb:
    pcVar9 = "Duration";
    goto LAB_001051bc;
  case 0xc:
    pcVar9 = "DateTime";
    goto LAB_001051bc;
  case 0xd:
    pcVar9 = "Date";
    goto LAB_0010512b;
  case 0xe:
    pcVar9 = "Time";
    goto LAB_0010512b;
  case 0xf:
    pcVar9 = "MonthDay";
    goto LAB_001051bc;
  case 0x10:
    pcVar9 = "YearMonth";
LAB_00105049:
    lVar12 = 9;
    break;
  case 0x11:
    pcVar9 = "Year";
    goto LAB_0010512b;
  case 0x12:
    pcVar9 = "Month";
    goto LAB_00105153;
  case 0x13:
    pcVar9 = "Day";
    lVar12 = 3;
    break;
  case 0x14:
    pcVar9 = "ID";
    lVar12 = 2;
    break;
  case 0x15:
    pcVar9 = "IDREF";
    goto LAB_00105153;
  case 0x16:
    pcVar9 = "ENTITY";
LAB_00105192:
    lVar12 = 6;
    break;
  case 0x17:
    pcVar9 = "NOTATION";
LAB_001051bc:
    lVar12 = 8;
    break;
  case 0x18:
    pcVar9 = "List";
LAB_0010512b:
    lVar12 = 4;
    break;
  case 0x19:
    pcVar9 = "Union";
LAB_00105153:
    lVar12 = 5;
    break;
  case 0x1a:
    pcVar9 = "AnySimpleType";
    lVar12 = 0xd;
    break;
  case 0x1b:
    pcVar9 = "UNKNOWN";
LAB_0010517d:
    lVar12 = 7;
    break;
  default:
    goto switchD_00104fb7_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar12);
switchD_00104fb7_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pRVar1 = *(RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> **)
            (dtValidator + 0x30);
  if ((pRVar1 != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
     (*(long *)(pRVar1 + 0x28) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Facets:\t\t\n",10);
    XVar2 = *(XMLSize_t *)(pRVar1 + 0x28);
    local_a0._vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00109c60;
    local_a0.fAdoptedElems = false;
    local_a0.fCurCount = 0;
    local_a0.fElemList = (char16_t **)0x0;
    local_a0.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
    local_a0.fMaxCount = XVar2;
    local_a0.fElemList =
         (char16_t **)
         (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                   (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,XVar2 * 8);
    if (XVar2 != 0) {
      XVar6 = 0;
      do {
        local_a0.fElemList[XVar6] = (char16_t *)0x0;
        XVar6 = XVar6 + 1;
      } while (XVar2 != XVar6);
    }
    local_a0._vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00109be8;
    local_60.super_XMLEnumerator<xercesc_4_0::KVStringPair>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00109cf0;
    local_60.fAdopted = false;
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
    local_60.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
    local_60.fCurHash = 0;
    pRVar3 = local_60.fCurElem;
    if (*(XMLSize_t *)(pRVar1 + 0x18) != 0) {
      XVar2 = 1;
      do {
        XVar6 = XVar2;
        pRVar3 = *(RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)
                  (*(long *)(pRVar1 + 0x10) + -8 + XVar6 * 8);
        if (pRVar3 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) break;
        XVar2 = XVar6 + 1;
        pRVar3 = local_60.fCurElem;
        local_60.fCurHash = XVar6;
      } while (XVar6 != *(XMLSize_t *)(pRVar1 + 0x18));
    }
    local_60.fCurElem = pRVar3;
    local_60.fToEnum = pRVar1;
    while ((XVar2 = local_a0.fCurCount,
           local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_60.fCurHash != *(XMLSize_t *)(local_60.fToEnum + 0x18)))) {
      pKVar7 = xercesc_4_0::
               RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&local_60);
      XVar2 = local_a0.fCurCount;
      toInsert = *(wchar16 **)(pKVar7 + 0x18);
      getAt = 0;
      XVar6 = getAt;
      if (local_a0.fCurCount != 0) {
        do {
          pcVar8 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(&local_a0,getAt);
          iVar5 = xercesc_4_0::XMLString::compareString(toInsert,pcVar8);
          if (iVar5 < 0) {
            xercesc_4_0::BaseRefVectorOf<char16_t>::insertElementAt(&local_a0,toInsert,getAt);
            XVar6 = getAt;
            break;
          }
          getAt = getAt + 1;
          XVar6 = XVar2;
        } while (XVar2 != getAt);
      }
      if (XVar6 == XVar2) {
        xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(&local_a0,1);
        local_a0.fElemList[local_a0.fCurCount] = toInsert;
        local_a0.fCurCount = local_a0.fCurCount + 1;
      }
    }
    if (local_a0.fCurCount != 0) {
      XVar6 = 0;
      do {
        pcVar8 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(&local_a0,XVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                   (pcVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_68.fLocalForm = pcVar9;
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar10 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=",1);
        if ((pcVar8 == (char16_t *)0x0) || (uVar11 = (ulong)(ushort)*pcVar8, uVar11 == 0)) {
          uVar11 = 0;
        }
        else {
          cVar15 = pcVar8[1];
          if (cVar15 != L'\0') {
            pcVar13 = pcVar8 + 2;
            do {
              uVar11 = (ulong)(ushort)cVar15 + (uVar11 >> 0x18) + uVar11 * 0x26;
              cVar15 = *pcVar13;
              pcVar13 = pcVar13 + 1;
            } while (cVar15 != L'\0');
          }
          uVar11 = uVar11 % *(ulong *)(pRVar1 + 0x18);
        }
        plVar14 = (long *)(uVar11 * 8 + *(long *)(pRVar1 + 0x10));
        while( true ) {
          plVar14 = (long *)*plVar14;
          bVar4 = xercesc_4_0::StringHasher::equals
                            ((StringHasher *)(pRVar1 + 0x30),pcVar8,(void *)plVar14[2]);
          if (bVar4) break;
          plVar14 = plVar14 + 1;
        }
        pcVar9 = (char *)xercesc_4_0::XMLString::transcode
                                   (*(wchar16 **)(*plVar14 + 0x20),
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_70.fLocalForm = pcVar9;
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar10 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        StrX::~StrX(&local_70);
        StrX::~StrX(&local_68);
        XVar6 = XVar6 + 1;
      } while (XVar6 != XVar2);
    }
    xercesc_4_0::RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_60);
    xercesc_4_0::RefVectorOf<char16_t>::~RefVectorOf((RefVectorOf<char16_t> *)&local_a0);
  }
  this = (BaseRefVectorOf<char16_t> *)(**(code **)(*(long *)dtValidator + 0x30))();
  if (this != (BaseRefVectorOf<char16_t> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enumeration:\t\t\n",0xf);
    XVar2 = this->fCurCount;
    if (XVar2 != 0) {
      XVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        pcVar8 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this,XVar6);
        __s = (_func_int **)
              xercesc_4_0::XMLString::transcode
                        (pcVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_a0._vptr_BaseRefVectorOf = __s;
        if (__s == (_func_int **)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar10 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)__s,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        StrX::~StrX((StrX *)&local_a0);
        XVar6 = XVar6 + 1;
      } while (XVar2 != XVar6);
    }
  }
  return;
}

Assistant:

void processDatatypeValidator( const DatatypeValidator* dtValidator, bool margin )
{
    if( !dtValidator )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Base Datatype:\t\t";
    switch( dtValidator->getType() )
    {
    case DatatypeValidator::String:         std::cout << "string";      break;
    case DatatypeValidator::AnyURI:         std::cout << "AnyURI";      break;
    case DatatypeValidator::QName:          std::cout << "QName";       break;
    case DatatypeValidator::Name:           std::cout << "Name";        break;
    case DatatypeValidator::NCName:         std::cout << "NCName";      break;
    case DatatypeValidator::Boolean:        std::cout << "Boolean";     break;
    case DatatypeValidator::Float:          std::cout << "Float";       break;
    case DatatypeValidator::Double:         std::cout << "Double";      break;
    case DatatypeValidator::Decimal:        std::cout << "Decimal";     break;
    case DatatypeValidator::HexBinary:      std::cout << "HexBinary";   break;
    case DatatypeValidator::Base64Binary:   std::cout << "Base64Binary";break;
    case DatatypeValidator::Duration:       std::cout << "Duration";    break;
    case DatatypeValidator::DateTime:       std::cout << "DateTime";    break;
    case DatatypeValidator::Date:           std::cout << "Date";        break;
    case DatatypeValidator::Time:           std::cout << "Time";        break;
    case DatatypeValidator::MonthDay:       std::cout << "MonthDay";    break;
    case DatatypeValidator::YearMonth:      std::cout << "YearMonth";   break;
    case DatatypeValidator::Year:           std::cout << "Year";        break;
    case DatatypeValidator::Month:          std::cout << "Month";       break;
    case DatatypeValidator::Day:            std::cout << "Day";         break;
    case DatatypeValidator::ID:             std::cout << "ID";          break;
    case DatatypeValidator::IDREF:          std::cout << "IDREF";       break;
    case DatatypeValidator::ENTITY:         std::cout << "ENTITY";      break;
    case DatatypeValidator::NOTATION:       std::cout << "NOTATION";    break;
    case DatatypeValidator::List:           std::cout << "List";        break;
    case DatatypeValidator::Union:          std::cout << "Union";       break;
    case DatatypeValidator::AnySimpleType:  std::cout << "AnySimpleType"; break;
    case DatatypeValidator::UnKnown:        std::cout << "UNKNOWN";     break;
    }

    std::cout << "\n";

    // Facets
	RefHashTableOf<KVStringPair>* facets = dtValidator->getFacets();
    if( facets && facets->getCount()>0)
    {
        XMLSize_t i;
        // Element's properties
        std::cout << "Facets:\t\t\n";
        // use a list to print them sorted, or the list could be different on 64-bit machines
        RefVectorOf<XMLCh> sortedList(facets->getCount(), false);
        RefHashTableOfEnumerator<KVStringPair> enumFacets(facets);
        while( enumFacets.hasMoreElements() )
        {
            const KVStringPair& curPair = enumFacets.nextElement();
            const XMLCh* key=curPair.getKey();
            XMLSize_t len=sortedList.size();
            for(i=0;i<len;i++)
                if(XMLString::compareString(key, sortedList.elementAt(i))<0)
                {
                    sortedList.insertElementAt((XMLCh*)key,i);
                    break;
                }
            if(i==len)
                sortedList.addElement((XMLCh*)key);
        }

        XMLSize_t len=sortedList.size();
        for(i=0;i<len;i++)
        {
            const XMLCh* key = sortedList.elementAt(i);
            std::cout << "\t" << StrX( key )    << "="
                         << StrX( facets->get(key)->getValue() )  << "\n";
        }
    }

	// Enumerations
	RefVectorOf<XMLCh>* enums = (RefVectorOf<XMLCh>*) dtValidator->getEnumString();
	if (enums)
	{
		std::cout << "Enumeration:\t\t\n";

		XMLSize_t enumLength = enums->size();
		for ( XMLSize_t i = 0; i < enumLength; i++)
        {
            std::cout << "\t" << StrX( enums->elementAt(i)) << "\n";
        }

	}
}